

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

bool __thiscall clipp::parser::try_match_blocked(parser *this,parser *parse,arg_string *arg)

{
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  value_type *__x;
  
  paVar1 = (parse->args_).
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (parse->args_).
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (parse->pos_).ignoreBlocks_ = true;
  bVar3 = try_match(parse,arg);
  if (bVar3) {
    for (__x = (parse->args_).
               super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (int)(((long)paVar2 - (long)paVar1) / 0x50);
        __x != (parse->args_).
               super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
               ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::
      push_back(&this->args_,__x);
      (this->args_).
      super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].blocked_ = true;
    }
  }
  return bVar3;
}

Assistant:

bool try_match_blocked(parser&& parse, const arg_string& arg)
    {
        const auto nold = int(parse.args_.size());

        parse.pos_.ignore_blocking(true);

        if(!parse.try_match(arg)) return false;

        for(auto i = parse.args_.begin() + nold; i != parse.args_.end(); ++i) {
            args_.push_back(*i);
            args_.back().blocked_ = true;
        }
        return true;
    }